

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_BookReader_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  int32_t local_54;
  uint64_t uStack_50;
  int32_t val;
  uint64_t w;
  char *mark;
  void *pval;
  flatcc_builder_ref_t ref;
  int more;
  void *struct_base_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  _ref = (char *)struct_base;
  struct_base_local = end;
  end_local = buf;
  buf_local = (char *)ctx;
  end_local = flatcc_json_parser_object_start(ctx,buf,end,(int *)((long)&pval + 4));
  do {
    if (pval._4_4_ == 0) {
      return end_local;
    }
    end_local = flatcc_json_parser_symbol_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    uStack_50 = flatcc_json_parser_symbol_part(end_local,(char *)struct_base_local);
    if (uStack_50 == 0x626f6f6b735f7265) {
      end_local = end_local + 8;
      uStack_50 = flatcc_json_parser_symbol_part(end_local,(char *)struct_base_local);
      if ((uStack_50 & 0xffff000000000000) == 0x6164000000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,2);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          local_54 = 0;
          mark = _ref;
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_int32
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,&local_54);
          if (((char *)w == end_local) &&
             ((w = (uint64_t)end_local,
              end_local = flatcc_json_parser_symbolic_int32
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)struct_base_local,
                                     Fantasy_BookReader_parse_json_struct_inline::symbolic_parsers,
                                     &local_54), end_local == (char *)w ||
              (end_local == (char *)struct_base_local)))) {
            pcVar1 = flatcc_json_parser_set_error
                               ((flatcc_json_parser_t *)buf_local,end_local,
                                (char *)struct_base_local,0x23);
            return pcVar1;
          }
          flatbuffers_int32_write_to_pe(mark,local_54);
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else {
      end_local = flatcc_json_parser_unmatched_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    }
    end_local = flatcc_json_parser_object_end
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,
                           (int *)((long)&pval + 4));
  } while( true );
}

Assistant:

static const char *Fantasy_BookReader_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x626f6f6b735f7265) { /* descend "books_re" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xffff000000000000) == 0x6164000000000000) { /* "ad" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                if (mark != buf) {
                    int32_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_Fantasy_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_int32(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int32(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int32_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "ad" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "ad" */
        } else { /* descend "books_re" */
            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        } /* descend "books_re" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}